

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Seanet.h
# Opt level: O3

int HeadDataReplyAndAuxDataSeanet
              (SEANET *pSeanet,uchar *scanline,double *pAngle,uchar *strippedauxdatabuf,
              int *pNbstrippedauxdatabytes)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  int mid;
  int local_860;
  int local_85c;
  uchar *local_858;
  double *local_850;
  uchar *local_848;
  int *local_840;
  uchar local_838 [15];
  undefined1 local_829;
  byte local_828;
  undefined4 local_826;
  byte local_81e;
  ushort local_81d;
  byte local_81b;
  byte local_81a;
  undefined4 local_817;
  ushort local_813;
  byte local_811;
  ushort local_810;
  ushort local_80e;
  byte local_80c [2012];
  
  local_85c = 0;
  local_858 = scanline;
  local_850 = pAngle;
  local_848 = strippedauxdatabuf;
  local_840 = pNbstrippedauxdatabytes;
  memset(local_838,0,0x800);
  local_860 = 0;
  iVar2 = GetMsgWithoutMIDSeanet(pSeanet,&local_85c,local_838,0x800,&local_860);
  if (iVar2 == 0) {
    iVar2 = 5;
    do {
      iVar2 = iVar2 + -1;
      if (iVar2 == 0) break;
      if (local_85c == 8) {
        lVar4 = (long)local_860;
        memcpy(local_848,&local_829,lVar4 - 0xfU);
        *local_840 = (int)(lVar4 - 0xfU);
      }
      else if (local_85c == 2) {
        pSeanet->HeadStatus = (uint)local_828;
        uVar5 = (ulong)(CONCAT24((short)((uint)local_826 >> 0x10),local_826) & 0xffff0000ffff);
        pSeanet->HeadHdCtrl = (HDCTRL)(int)uVar5;
        pSeanet->HeadRangescale = (int)(uVar5 >> 0x20);
        pSeanet->HeadIGain = (uint)local_81e;
        pSeanet->HeadSlope = (uint)local_81d;
        pSeanet->HeadADSpan = (uint)local_81b;
        pSeanet->HeadADLow = (uint)local_81a;
        uVar5 = (ulong)CONCAT24((short)((uint)local_817 >> 0x10),local_817) & 0xffffffff0000ffff;
        pSeanet->HeadADInterval = (int)uVar5;
        pSeanet->HeadLeftLim = (int)(uVar5 >> 0x20);
        pSeanet->HeadRightLim = (uint)local_813;
        pSeanet->HeadSteps = (uint)local_811;
        *local_850 = (double)(int)((uint)local_810 + ((local_810 + 0xc80) / 0x1900) * -0x1900 +
                                  0xc80) * 0.05625;
        pSeanet->Dbytes = (uint)local_80e;
        if (local_80e + 0x2d == local_860) {
          if (pSeanet->adc8on != 0) {
            memcpy(local_858,local_80c,(ulong)local_80e);
            pSeanet->HeadNBins = pSeanet->Dbytes;
            return 0;
          }
          iVar2 = 0;
          if (local_80e != 0) {
            lVar4 = 0;
            do {
              bVar1 = local_80c[lVar4];
              local_858[lVar4 * 2] = bVar1 & 0xf0;
              local_858[lVar4 * 2 + 1] = bVar1 << 4;
              lVar4 = lVar4 + 1;
            } while (lVar4 < pSeanet->Dbytes);
            iVar2 = pSeanet->Dbytes * 2;
          }
          pSeanet->HeadNBins = iVar2;
          return 0;
        }
        break;
      }
      memset(local_838,0,0x800);
      local_860 = 0;
      iVar3 = GetMsgWithoutMIDSeanet(pSeanet,&local_85c,local_838,0x800,&local_860);
    } while (iVar3 == 0);
  }
  puts("A Seanet is not responding correctly. ");
  return 1;
}

Assistant:

inline int HeadDataReplyAndAuxDataSeanet(SEANET* pSeanet, 
										 unsigned char* scanline, double* pAngle, 
										 unsigned char* strippedauxdatabuf, int* pNbstrippedauxdatabytes)
{
	unsigned char databuf[MAX_NB_BYTES_SEANET];
	int nbdatabytes = 0;
	int mid = 0;
	int i = 0;
	uShort_SEANET word;
	int j = 0;

	// Use this kind of while for all messages?
	while (mid != mtHeadData)
	{
		// Wait for a message.
		memset(databuf, 0, sizeof(databuf));
		nbdatabytes = 0;
		//if (GetLatestMsgWithoutMIDSeanet(pSeanet, &mid, databuf, sizeof(databuf), &nbdatabytes)
		//	!= EXIT_SUCCESS)
		if (GetMsgWithoutMIDSeanet(pSeanet, &mid, databuf, sizeof(databuf), &nbdatabytes)
			!= EXIT_SUCCESS)
		{ 
			printf("A Seanet is not responding correctly. \n");
			return EXIT_FAILURE;	
		}

		// Message counter...
		i++;
		if (i > 4) 
		{
			printf("A Seanet is not responding correctly. \n");
			return EXIT_FAILURE;	
		}

		if (mid == mtAuxData)
		{
			// Should remove also the final LF...

			//memcpy(auxdatabuf, databuf, nbdatabytes);
			//*pNbauxdatabytes = nbdatabytes;
			memcpy(strippedauxdatabuf, databuf+15, nbdatabytes-15);
			*pNbstrippedauxdatabytes = nbdatabytes-15;
		}
	}

	// Analyze data.

	//memset(pSeanetData, 0, sizeof(SEANETDATA));

	// Head Status.
	pSeanet->HeadStatus = (unsigned char)databuf[16];

	// HdCtrl.
	word.c[0] = (unsigned char)databuf[18]; // LSB.
	word.c[1] = (unsigned char)databuf[19]; // MSB.
	pSeanet->HeadHdCtrl.i = word.v;

	// Rangescale. Normally, we should check the unit but it should have been requested in m...
	word.c[0] = (unsigned char)databuf[20]; // LSB.
	word.c[1] = (unsigned char)databuf[21]; // MSB.
	pSeanet->HeadRangescale = word.v;

	// Gain.
	pSeanet->HeadIGain = (unsigned char)databuf[26];

	// Slope.
	word.c[0] = (unsigned char)databuf[27]; // LSB.
	word.c[1] = (unsigned char)databuf[28]; // MSB.
	pSeanet->HeadSlope = word.v;

	// ADSpan.
	pSeanet->HeadADSpan = (unsigned char)databuf[29];

	// ADLow.
	pSeanet->HeadADLow = (unsigned char)databuf[30];

	// ADInterval.
	word.c[0] = (unsigned char)databuf[33]; // LSB.
	word.c[1] = (unsigned char)databuf[34]; // MSB.
	pSeanet->HeadADInterval = word.v;

	// LeftLim.
	word.c[0] = (unsigned char)databuf[35]; // LSB.
	word.c[1] = (unsigned char)databuf[36]; // MSB.
	pSeanet->HeadLeftLim = word.v;

	// RightLim.
	word.c[0] = (unsigned char)databuf[37]; // LSB.
	word.c[1] = (unsigned char)databuf[38]; // MSB.
	pSeanet->HeadRightLim = word.v;

	// Steps.
	pSeanet->HeadSteps = (unsigned char)databuf[39];

	// Transducer Bearing. 
	// This is the position of the transducer for the current scanline (0..6399 in 1/16 Gradian units).

	// Ahead corresponds to 3200?

	word.c[0] = (unsigned char)databuf[40]; // LSB.
	word.c[1] = (unsigned char)databuf[41]; // MSB.
	*pAngle = ((word.v-3200+6400)%6400)*0.05625; // Angle of the transducer in degrees (0.05625 = (1/16)*(9/10)).

	// Dbytes.
	word.c[0] = (unsigned char)databuf[42]; // LSB.
	word.c[1] = (unsigned char)databuf[43]; // MSB.
	pSeanet->Dbytes = word.v; // Dbytes defines the number of Range Bins that the sonar will generate for the Head Data reply message.

	// There are 44 bytes of Message Header and Device Parameter Block.

	if (44+pSeanet->Dbytes+1 != nbdatabytes)
	{ 
		printf("A Seanet is not responding correctly. \n");
		return EXIT_FAILURE;	
	}

	// We should take into account ADLow and ADSpan here?

	// Retrieve the scanline data from the data received.
	if (!pSeanet->adc8on)	
	{ 
		// If adc8on = 0, the scanlines data received are in 4 bit (1/2 byte).
		// The amplitude values are between 0 and 15 so we multiply by 16
		// to get values between 0 and 255.
		for (j = 0; j < pSeanet->Dbytes; j++)
		{
			scanline[2*j+0] = (unsigned char)((databuf[j+44]>>4)*16);
			scanline[2*j+1] = (unsigned char)(((databuf[j+44]<<4)>>4)*16);
		}
		pSeanet->HeadNBins = 2*pSeanet->Dbytes;
	}
	else	
	{
		// If adc8on = 1, the scanlines data received are in 8 bit (1 byte).
		// The amplitude values are between 0 and 255.
		memcpy(scanline, databuf+44, pSeanet->Dbytes); // Copy the data received without the header (which was the 44 first bytes).
		pSeanet->HeadNBins = pSeanet->Dbytes;
	}

	// Last data...?

	return EXIT_SUCCESS;
}